

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTrace.cpp
# Opt level: O0

void __thiscall
llbuild::core::BuildEngineTrace::finishedTask
          (BuildEngineTrace *this,Task *task,Rule *rule,bool wasChanged)

{
  FILE *__stream;
  char *pcVar1;
  char *pcVar2;
  iterator __position;
  char *pcVar3;
  FILE *fp;
  bool wasChanged_local;
  Rule *rule_local;
  Task *task_local;
  BuildEngineTrace *this_local;
  
  __stream = (FILE *)this->outputPtr;
  rule_local = (Rule *)task;
  task_local = (Task *)this;
  pcVar1 = getTaskName(this,task);
  pcVar2 = getRuleName(this,rule);
  pcVar3 = "unchanged";
  if (wasChanged) {
    pcVar3 = "changed";
  }
  fprintf(__stream,"{ \"finished-task\", \"%s\", \"%s\", \"%s\" },\n",pcVar1,pcVar2,pcVar3);
  __position = std::
               unordered_map<const_llbuild::core::Task_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_llbuild::core::Task_*>,_std::equal_to<const_llbuild::core::Task_*>,_std::allocator<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(&this->taskNames,(key_type *)&rule_local);
  std::
  unordered_map<const_llbuild::core::Task_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_llbuild::core::Task_*>,_std::equal_to<const_llbuild::core::Task_*>,_std::allocator<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::erase(&this->taskNames,__position);
  return;
}

Assistant:

void BuildEngineTrace::finishedTask(const Task* task, const Rule* rule,
                                    bool wasChanged) {
  FILE *fp = static_cast<FILE*>(outputPtr);

  fprintf(fp, "{ \"finished-task\", \"%s\", \"%s\", \"%s\" },\n",
          getTaskName(task), getRuleName(rule),
          wasChanged ? "changed" : "unchanged");

  // Delete the task entry, as it could be reused.
  taskNames.erase(taskNames.find(task));
}